

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

void Gia_Sim2InfoTransfer(Gia_Sim2_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint *pInfo;
  uint *pInfo0_00;
  bool bVar3;
  int local_34;
  int i;
  uint *pInfo1;
  uint *pInfo0;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Sim2_t *p_local;
  
  local_34 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p->pAig);
    bVar3 = false;
    if (local_34 < iVar2) {
      pGVar1 = p->pAig;
      iVar2 = Gia_ManPoNum(p->pAig);
      pInfo0 = (uint *)Gia_ManCo(pGVar1,iVar2 + local_34);
      bVar3 = false;
      if ((Gia_Obj_t *)pInfo0 != (Gia_Obj_t *)0x0) {
        pGVar1 = p->pAig;
        iVar2 = Gia_ManPiNum(p->pAig);
        pObjRi = Gia_ManCi(pGVar1,iVar2 + local_34);
        bVar3 = pObjRi != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar3) break;
    iVar2 = Gia_ObjValue(pObjRi);
    pInfo = Gia_Sim2Data(p,iVar2);
    iVar2 = Gia_ObjValue((Gia_Obj_t *)pInfo0);
    pInfo0_00 = Gia_Sim2Data(p,iVar2);
    Gia_Sim2InfoCopy(p,pInfo,pInfo0_00);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

static inline void Gia_Sim2InfoTransfer( Gia_Sim2_t * p )
{
    Gia_Obj_t * pObjRo, * pObjRi;
    unsigned * pInfo0, * pInfo1;
    int i;
    Gia_ManForEachRiRo( p->pAig, pObjRi, pObjRo, i )
    {
        pInfo0 = Gia_Sim2Data( p, Gia_ObjValue(pObjRo) );
        pInfo1 = Gia_Sim2Data( p, Gia_ObjValue(pObjRi) );
        Gia_Sim2InfoCopy( p, pInfo0, pInfo1 );
    }
}